

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint *puVar1;
  float fVar2;
  BBox1f BVar3;
  long lVar4;
  undefined4 uVar5;
  char unaff_BL;
  long unaff_RBP;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 local_38 [8];
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar6 = r->_begin;
  if (uVar6 < r->_end) {
    vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
    vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    do {
      auVar9._8_8_ = 0;
      auVar9._0_4_ = (this->super_LineSegments).super_Geometry.time_range.lower;
      auVar9._4_4_ = (this->super_LineSegments).super_Geometry.time_range.upper;
      auVar7 = vmovshdup_avx512vl(auVar9);
      auVar7 = vsubss_avx512f(auVar7,auVar9);
      auVar8 = vsubss_avx512f(ZEXT416((uint)t0t1->upper),auVar9);
      auVar8 = vdivss_avx512f(auVar8,auVar7);
      auVar8 = vmulss_avx512f(auVar8,SUB6416(ZEXT464(0x3f7ffffc),0));
      lVar4 = *(long *)&(this->super_LineSegments).super_Geometry.field_0x58;
      if ((ulong)(*(int *)(lVar4 + *(long *)&(this->super_LineSegments).field_0x68 * uVar6) + 1) <
          (((this->super_LineSegments).vertices.items)->super_RawBufferView).num) {
        fVar2 = t0t1->lower;
        auVar10 = ZEXT416((uint)(this->super_LineSegments).super_Geometry.fnumTimeSegments);
        auVar8 = vmulss_avx512f(auVar10,auVar8);
        auVar8 = vrndscaless_avx512f(auVar8,auVar8);
        *(char *)(unaff_RBP + -0x14) = *(char *)(unaff_RBP + -0x14) + unaff_BL;
        uVar5 = vcvttss2si_avx512f(auVar8);
        auVar8 = vsubss_avx512f(ZEXT416((uint)fVar2),auVar9);
        auVar7 = vdivss_avx512f(auVar8,auVar7);
        auVar7 = vmulss_avx512f(auVar7,ZEXT416(0x3f800002));
        auVar7 = vmulss_avx512f(auVar10,auVar7);
        vrndscaless_avx512f(auVar7,auVar7);
        puVar1 = (uint *)(CONCAT44((int)((ulong)lVar4 >> 0x20),uVar5) + -0x5f);
        *puVar1 = *puVar1 | (uint)local_38;
        halt_baddata();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < r->_end);
    (__return_storage_ptr__->object_range)._end = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  BVar3 = (BBox1f)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  __return_storage_ptr__->time_range = BVar3;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  (__return_storage_ptr__->max_time_range).upper = 1.0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }